

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testMatchAlphabet(diff_match_patch_test *this)

{
  pair<std::_Rb_tree_iterator<std::pair<const_wchar_t,_int>_>,_bool> pVar1;
  allocator<wchar_t> local_209;
  wstring local_208 [32];
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> local_1e8;
  allocator<wchar_t> local_1b1;
  wstring local_1b0;
  _Base_ptr local_190;
  undefined1 local_188;
  int local_180;
  wchar_t local_17c;
  _Base_ptr local_178;
  undefined1 local_170;
  int local_168;
  wchar_t local_164;
  _Base_ptr local_160;
  undefined1 local_158;
  int local_150;
  wchar_t local_14c;
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> local_148;
  allocator<wchar_t> local_111;
  wstring local_110 [32];
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> local_f0;
  allocator<wchar_t> local_b9;
  wstring local_b8;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_88;
  wchar_t local_84;
  _Base_ptr local_80;
  undefined1 local_78;
  int local_70;
  wchar_t local_6c;
  _Base_ptr local_68;
  undefined1 local_60;
  int local_48;
  wchar_t local_44;
  undefined1 local_40 [8];
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> bitmask;
  diff_match_patch_test *this_local;
  
  bitmask._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::map
            ((map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
              *)local_40);
  local_44 = L'a';
  local_48 = 4;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_44,&local_48);
  local_68 = (_Base_ptr)pVar1.first._M_node;
  local_60 = pVar1.second;
  local_6c = L'b';
  local_70 = 2;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_6c,&local_70);
  local_80 = (_Base_ptr)pVar1.first._M_node;
  local_78 = pVar1.second;
  local_84 = L'c';
  local_88 = 1;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_84,&local_88);
  local_98 = (_Base_ptr)pVar1.first._M_node;
  local_90 = pVar1.second;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_b8,L"match_alphabet: Unique.",&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_110,L"abc",&local_111);
  diff_match_patch::match_alphabet((wstring *)&local_f0);
  assertEquals(this,&local_b8,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)local_40,&local_f0);
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::~map
            (&local_f0);
  std::__cxx11::wstring::~wstring(local_110);
  std::allocator<wchar_t>::~allocator(&local_111);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::allocator<wchar_t>::~allocator(&local_b9);
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_148._M_t._M_impl._0_8_ = 0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::map
            (&local_148);
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::
  operator=((map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
             *)local_40,&local_148);
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::~map
            (&local_148);
  local_14c = L'a';
  local_150 = 0x25;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_14c,&local_150);
  local_160 = (_Base_ptr)pVar1.first._M_node;
  local_158 = pVar1.second;
  local_164 = L'b';
  local_168 = 0x12;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_164,&local_168);
  local_178 = (_Base_ptr)pVar1.first._M_node;
  local_170 = pVar1.second;
  local_17c = L'c';
  local_180 = 8;
  pVar1 = std::map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>::
          emplace<wchar_t,int>
                    ((map<wchar_t,int,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
                      *)local_40,&local_17c,&local_180);
  local_190 = (_Base_ptr)pVar1.first._M_node;
  local_188 = pVar1.second;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1b0,L"match_alphabet: Duplicates.",&local_1b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_208,L"abcaba",&local_209);
  diff_match_patch::match_alphabet((wstring *)&local_1e8);
  assertEquals(this,&local_1b0,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)local_40,&local_1e8);
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::~map
            (&local_1e8);
  std::__cxx11::wstring::~wstring(local_208);
  std::allocator<wchar_t>::~allocator(&local_209);
  std::__cxx11::wstring::~wstring((wstring *)&local_1b0);
  std::allocator<wchar_t>::~allocator(&local_1b1);
  std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::~map
            ((map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
              *)local_40);
  return;
}

Assistant:

void diff_match_patch_test::testMatchAlphabet() {
  // Initialise the bitmasks for Bitap.
  std::map<wchar_t, int> bitmask;
  bitmask.emplace(L'a', 4);
  bitmask.emplace(L'b', 2);
  bitmask.emplace(L'c', 1);
  assertEquals(L"match_alphabet: Unique.", bitmask, dmp.match_alphabet(L"abc"));

  bitmask = std::map<wchar_t, int>();
  bitmask.emplace(L'a', 37);
  bitmask.emplace(L'b', 18);
  bitmask.emplace(L'c', 8);
  assertEquals(L"match_alphabet: Duplicates.", bitmask, dmp.match_alphabet(L"abcaba"));
}